

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

string * __thiscall
cpp_client::Connection::recieve_abi_cxx11_(string *__return_storage_ptr__,Connection *this)

{
  undefined8 in_RAX;
  ostream *poVar1;
  ostream *poVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  Connection_internal::recieve_abi_cxx11_
            (__return_storage_ptr__,
             (this->conn_)._M_t.
             super___uniq_ptr_impl<cpp_client::Connection_internal,_std::default_delete<cpp_client::Connection_internal>_>
             ._M_t.
             super__Tuple_impl<0UL,_cpp_client::Connection_internal_*,_std::default_delete<cpp_client::Connection_internal>_>
             .super__Head_base<0UL,_cpp_client::Connection_internal_*,_false>._M_head_impl);
  if (this->print_communication_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[",2);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x23);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"m",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"FROM SERVER <-- ",0x10);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(__return_storage_ptr__->_M_dataplus)._M_p,
                        __return_storage_ptr__->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\x1b[",2);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"m",1);
    uStack_18 = CONCAT17(10,(undefined7)uStack_18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Connection::recieve()
{
   auto msg = conn_->recieve();
   if(print_communication_)
   {
      std::cout << sgr::text_magenta << "FROM SERVER <-- " << msg << sgr::reset << '\n';
   }
   return msg;
}